

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzconnect.cpp
# Opt level: O0

void __thiscall TPZConnect::Write(TPZConnect *this,TPZStream *buf,int withclassid)

{
  byte bVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  TPZSavable *in_RDI;
  TPZStream *in_stack_ffffffffffffffd8;
  
  (**(code **)(*in_RSI + 0x28))(in_RSI,in_RDI + 1,1);
  (**(code **)(*in_RSI + 0x18))(in_RSI,in_RDI + 2,1);
  (**(code **)(*in_RSI + 0x20))(in_RSI,(undefined1 *)((long)&in_RDI[2]._vptr_TPZSavable + 4),1);
  (**(code **)(*in_RSI + 0x50))(in_RSI,(undefined1 *)((long)&in_RDI[2]._vptr_TPZSavable + 4),1);
  (**(code **)(*in_RSI + 0x50))(in_RSI,(undefined1 *)((long)&in_RDI[2]._vptr_TPZSavable + 5),1);
  (**(code **)(*in_RSI + 0x50))(in_RSI,(undefined1 *)((long)&in_RDI[2]._vptr_TPZSavable + 6),1);
  bVar1 = *(byte *)((long)&in_RDI[2]._vptr_TPZSavable + 7) & 1;
  (**(code **)(*in_RSI + 0x10))(in_RSI,bVar1,extraout_RDX,bVar1);
  (**(code **)(*in_RSI + 0x20))(in_RSI,in_RDI + 3,1);
  TPZPersistenceManager::WritePointer(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void TPZConnect::Write(TPZStream &buf, int withclassid) const { //ok
    buf.Write(&fSequenceNumber);
    buf.Write(&fNElConnected);
    buf.Write(&fFlags);
    buf.Write(&fCompose.fOrder);
    buf.Write(&fCompose.fNState);
    buf.Write(&fCompose.fLagrangeMultiplier);
    buf.Write(fCompose.fIsCondensed);
    buf.Write(&fNShape);
    TPZPersistenceManager::WritePointer(fDependList, &buf);
}